

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::
stringifyBinaryExpr<boost::iterator_range<burst::difference_iterator<std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::less<void>>>,std::vector<int,std::allocator<int>>>
          (String *__return_storage_ptr__,detail *this,
          iterator_range<burst::difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>_>
          *lhs,char *op,vector<int,_std::allocator<int>_> *rhs)

{
  ostream *stream;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  stream = tlssPush();
  filldata<boost::iterator_range<burst::difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>_>_>
  ::fill(stream,(iterator_range<burst::difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>_>
                 *)this);
  tlssPop();
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  String::String(&SStack_78,"{?}");
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }